

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O2

string * __thiscall
LinearRegression::generatePrintFunction_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  string *psVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t __position;
  string sStack_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  string local_108;
  string printGrad;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string *local_88;
  var_bitset *local_80;
  var_bitset *local_78;
  string local_70;
  string printParam;
  
  local_88 = __return_storage_ptr__;
  offset_abi_cxx11_(&sStack_1e8,this,2);
  std::operator+(&local_1a8,&sStack_1e8,"std::cout << \"param_int = \" << ");
  std::operator+(&local_168,&local_1a8,"params[");
  std::__cxx11::to_string
            (&local_1c8,
             (this->_parameterIndex).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[100]);
  std::operator+(&printGrad,&local_168,&local_1c8);
  std::operator+(&printParam,&printGrad,"] << \";\\n\";\n");
  std::__cxx11::string::~string((string *)&printGrad);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  offset_abi_cxx11_(&local_1c8,this,2);
  std::operator+(&sStack_1e8,&local_1c8,"std::cout << \"grad_int = \" << ");
  std::operator+(&local_1a8,&sStack_1e8,"grad[");
  std::__cxx11::to_string
            (&local_188,
             (this->_parameterIndex).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[100]);
  std::operator+(&local_168,&local_1a8,&local_188);
  std::operator+(&printGrad,&local_168,"] << \";\\n\";\n");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  local_78 = &(this->super_Application)._features;
  local_80 = &this->_categoricalFeatures;
  for (__position = 0; __position != 100; __position = __position + 1) {
    bVar2 = std::bitset<100UL>::test(local_78,__position);
    if (bVar2) {
      bVar2 = std::bitset<100UL>::test(local_80,__position);
      if (bVar2) {
        offset_abi_cxx11_(&local_148,this,2);
        std::operator+(&local_c8,&local_148,"for (std::pair<int,size_t> tuple : index_");
        getAttributeName_abi_cxx11_(&local_108,this,__position);
        std::operator+(&local_a8,&local_c8,&local_108);
        std::operator+(&local_188,&local_a8,")\n");
        offset_abi_cxx11_(&local_128,this,3);
        std::operator+(&local_1c8,&local_188,&local_128);
        std::operator+(&sStack_1e8,&local_1c8,"std::cout << \"param_");
        getAttributeName_abi_cxx11_(&local_70,this,__position);
        std::operator+(&local_1a8,&sStack_1e8,&local_70);
        std::operator+(&local_168,&local_1a8,
                       "[\"<< tuple.first <<\"] = \"<< params[tuple.second] << \";\\n\";\n");
        std::__cxx11::string::append((string *)&printParam);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&sStack_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_148);
        offset_abi_cxx11_(&local_148,this,2);
        std::operator+(&local_c8,&local_148,"for (std::pair<int,size_t> tuple : index_");
        getAttributeName_abi_cxx11_(&local_108,this,__position);
        std::operator+(&local_a8,&local_c8,&local_108);
        std::operator+(&local_188,&local_a8,")\n");
        offset_abi_cxx11_(&local_128,this,3);
        std::operator+(&local_1c8,&local_188,&local_128);
        std::operator+(&sStack_1e8,&local_1c8,"std::cout << \"grad_");
        getAttributeName_abi_cxx11_(&local_70,this,__position);
        std::operator+(&local_1a8,&sStack_1e8,&local_70);
        std::operator+(&local_168,&local_1a8,
                       "[\"<< tuple.first <<\"] = \"<< grad[tuple.second] << \";\\n\";\n");
        std::__cxx11::string::append((string *)&printGrad);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&sStack_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_c8);
        this_00 = &local_148;
      }
      else {
        offset_abi_cxx11_(&local_a8,this,2);
        std::operator+(&local_188,&local_a8,"std::cout << \"param_");
        getAttributeName_abi_cxx11_(&local_c8,this,__position);
        std::operator+(&local_1c8,&local_188,&local_c8);
        std::operator+(&sStack_1e8,&local_1c8," = \" << params[");
        std::__cxx11::to_string
                  (&local_148,
                   (this->_parameterIndex).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[__position]);
        std::operator+(&local_1a8,&sStack_1e8,&local_148);
        std::operator+(&local_168,&local_1a8,"] << \";\\n\";\n");
        std::__cxx11::string::append((string *)&printParam);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&sStack_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_a8);
        offset_abi_cxx11_(&local_a8,this,2);
        std::operator+(&local_188,&local_a8,"std::cout << \"grad_");
        getAttributeName_abi_cxx11_(&local_c8,this,__position);
        std::operator+(&local_1c8,&local_188,&local_c8);
        std::operator+(&sStack_1e8,&local_1c8," = \" << grad[");
        std::__cxx11::to_string
                  (&local_148,
                   (this->_parameterIndex).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[__position]);
        std::operator+(&local_1a8,&sStack_1e8,&local_148);
        std::operator+(&local_168,&local_1a8,"] <<\";\\n\";\n");
        std::__cxx11::string::append((string *)&printGrad);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&sStack_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_188);
        this_00 = &local_a8;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
  }
  offset_abi_cxx11_(&local_148,this,1);
  std::operator+(&local_c8,&local_148,"void printOutput()\n");
  offset_abi_cxx11_(&local_108,this,1);
  std::operator+(&local_a8,&local_c8,&local_108);
  std::operator+(&local_188,&local_a8,"{\n");
  std::operator+(&local_1c8,&local_188,&printParam);
  std::operator+(&sStack_1e8,&local_1c8,"\n");
  std::operator+(&local_1a8,&sStack_1e8,&printGrad);
  offset_abi_cxx11_(&local_128,this,1);
  std::operator+(&local_168,&local_1a8,&local_128);
  psVar1 = local_88;
  std::operator+(local_88,&local_168,"}\n");
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&printGrad);
  std::__cxx11::string::~string((string *)&printParam);
  return psVar1;
}

Assistant:

std::string LinearRegression::generatePrintFunction()
{
    std::string printParam = offset(2)+"std::cout << \"param_int = \" << "+
        "params["+std::to_string(_parameterIndex[NUM_OF_VARIABLES])+"] << \";\\n\";\n";
    
    std::string printGrad = offset(2)+"std::cout << \"grad_int = \" << "+
        "grad["+std::to_string(_parameterIndex[NUM_OF_VARIABLES])+"] << \";\\n\";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (!_categoricalFeatures.test(var))
        {
            printParam += offset(2)+"std::cout << \"param_"+getAttributeName(var)+" = "
                "\" << params["+std::to_string(_parameterIndex[var])+"] << \";\\n\";\n";
            printGrad += offset(2)+"std::cout << \"grad_"+getAttributeName(var)+" = "
                "\" << grad["+std::to_string(_parameterIndex[var])+"] <<\";\\n\";\n";
        }
        else
        {            
            printParam += offset(2)+"for (std::pair<int,size_t> tuple : index_"+
                getAttributeName(var)+")\n"+
                offset(3)+"std::cout << \"param_"+getAttributeName(var)+
                "[\"<< tuple.first <<\"] = \"<< params[tuple.second] << \";\\n\";\n";
            printGrad += offset(2)+"for (std::pair<int,size_t> tuple : index_"+
                getAttributeName(var)+")\n"+
                offset(3)+"std::cout << \"grad_"+getAttributeName(var)+
                "[\"<< tuple.first <<\"] = \"<< grad[tuple.second] << \";\\n\";\n";
        }
    }

    return offset(1)+"void printOutput()\n"+offset(1)+"{\n"+printParam+"\n"+
        printGrad+offset(1)+"}\n";
}